

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_rollback(fdb_kvs_handle **handle_ptr,fdb_seqnum_t seqnum)

{
  __int_type_conflict _Var1;
  fdb_kvs_handle *handle;
  fdb_log_callback_ex p_Var2;
  fdb_status fVar3;
  fdb_kvs_handle *handle_00;
  fdb_seqnum_t seqnum_00;
  bool bVar4;
  uint sleep_time;
  fdb_config config;
  
  fVar3 = FDB_RESULT_INVALID_HANDLE;
  if ((handle_ptr != (fdb_kvs_handle **)0x0) &&
     (handle = *handle_ptr, handle != (fdb_kvs_handle *)0x0)) {
    memcpy(&config,&handle->config,0xf8);
    if (handle->kvs != (kvs_info *)0x0) {
      fVar3 = fdb_kvs_rollback(handle_ptr,seqnum);
      return fVar3;
    }
    if (((handle->config).flags & 2) == 0) {
      LOCK();
      bVar4 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
      if (bVar4) {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
      }
      UNLOCK();
      fVar3 = FDB_RESULT_HANDLE_BUSY;
      if (bVar4) {
        filemgr_mutex_lock(handle->file);
        filemgr_set_rollback(handle->file,'\x01');
        bVar4 = wal_txn_exists(handle->file);
        if (bVar4) {
          filemgr_set_rollback(handle->file,'\0');
          filemgr_mutex_unlock(handle->file);
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
          fVar3 = FDB_RESULT_FAIL_BY_TRANSACTION;
        }
        else {
          sleep_time = 10000;
          while( true ) {
            _Var1 = (handle->file->status).super___atomic_base<unsigned_char>._M_i;
            filemgr_mutex_unlock(handle->file);
            if (_Var1 != '\x01') break;
            decaying_usleep(&sleep_time,1000000);
            filemgr_mutex_lock(handle->file);
          }
          if (_Var1 == '\x04') {
            fdb_check_file_reopen(handle,(file_status_t *)0x0);
          }
          fdb_sync_db_header(handle);
          if (handle->seqnum < seqnum) {
            filemgr_set_rollback(handle->file,'\0');
            LOCK();
            if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
              (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
            }
            UNLOCK();
            fVar3 = FDB_RESULT_NO_DB_INSTANCE;
          }
          else {
            handle_00 = (fdb_kvs_handle *)calloc(1,0x208);
            if (handle_00 == (fdb_kvs_handle *)0x0) {
              LOCK();
              if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
              }
              UNLOCK();
              fVar3 = FDB_RESULT_ALLOC_FAIL;
            }
            else {
              LOCK();
              (handle_00->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
              UNLOCK();
              (handle_00->log_callback).ctx_data = (handle->log_callback).ctx_data;
              p_Var2 = (handle->log_callback).callback_ex;
              (handle_00->log_callback).callback = (handle->log_callback).callback;
              (handle_00->log_callback).callback_ex = p_Var2;
              handle_00->fhandle = handle->fhandle;
              if (seqnum == 0) {
                fVar3 = _fdb_reset(handle_00,handle);
              }
              else {
                handle_00->max_seqnum = seqnum;
                fVar3 = _fdb_open(handle_00,handle->file->filename,FDB_AFILENAME,&config);
              }
              filemgr_set_rollback(handle->file,'\0');
              if (fVar3 == FDB_RESULT_SUCCESS) {
                filemgr_mutex_lock(handle->file);
                seqnum_00 = filemgr_get_seqnum(handle->file);
                filemgr_set_seqnum(handle->file,seqnum);
                filemgr_mutex_unlock(handle->file);
                fVar3 = _fdb_commit(handle_00,'\x01',((handle->config).durability_opt & 2) == 0);
                if (fVar3 == FDB_RESULT_SUCCESS) {
                  if (handle->txn != (fdb_txn *)0x0) {
                    handle_00->txn = handle->txn;
                    handle->txn = (fdb_txn *)0x0;
                  }
                  _fdb_kvs_close(handle);
                  free(handle);
                  _fdb_kvs_createNLinkKVHandle(handle_00->fhandle,handle_00);
                  handle_00->max_seqnum = 0;
                  handle_00->seqnum = seqnum;
                  *handle_ptr = handle_00;
                  return FDB_RESULT_SUCCESS;
                }
                filemgr_mutex_lock(handle->file);
                filemgr_set_seqnum(handle->file,seqnum_00);
                filemgr_mutex_unlock(handle->file);
              }
              free(handle_00);
              LOCK();
              if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
              }
              UNLOCK();
            }
          }
        }
      }
    }
    else {
      fVar3 = fdb_log_impl(&handle->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                           ,"fdb_rollback",0x4cd,
                           "Warning: Rollback is not allowed on the read-only DB file \'%s\'.",
                           handle->file->filename);
    }
  }
  return fVar3;
}

Assistant:

LIBFDB_API
fdb_status fdb_rollback(fdb_kvs_handle **handle_ptr, fdb_seqnum_t seqnum)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    fdb_kvs_handle *handle_in, *handle;
    fdb_status fs;
    fdb_seqnum_t old_seqnum;

    if (!handle_ptr) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    handle_in = *handle_ptr;

    if (!handle_in) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    config = handle_in->config;

    if (handle_in->kvs) {
        return fdb_kvs_rollback(handle_ptr, seqnum);
    }

    if (handle_in->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle_in->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on the read-only DB file '%s'.",
                       handle_in->file->filename);
    }

    if (!atomic_cas_uint8_t(&handle_in->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    filemgr_mutex_lock(handle_in->file);
    filemgr_set_rollback(handle_in->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(handle_in->file)) {
        filemgr_set_rollback(handle_in->file, 0);
        filemgr_mutex_unlock(handle_in->file);
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(handle_in->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(handle_in->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(handle_in->file);
        fstatus = filemgr_get_file_status(handle_in->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(handle_in->file);
        fdb_check_file_reopen(handle_in, NULL);
    } else {
        filemgr_mutex_unlock(handle_in->file);
    }

    fdb_sync_db_header(handle_in);

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum > handle_in->seqnum) {
        filemgr_set_rollback(handle_in->file, 0); // allow mutations
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->log_callback = handle_in->log_callback;
    handle->fhandle = handle_in->fhandle;
    if (seqnum == 0) {
        fs = _fdb_reset(handle, handle_in);
    } else {
        handle->max_seqnum = seqnum;
        fs = _fdb_open(handle, handle_in->file->filename, FDB_AFILENAME,
                       &config);
    }

    filemgr_set_rollback(handle_in->file, 0); // allow mutations
    if (fs == FDB_RESULT_SUCCESS) {
        // rollback the file's sequence number
        filemgr_mutex_lock(handle_in->file);
        old_seqnum = filemgr_get_seqnum(handle_in->file);
        filemgr_set_seqnum(handle_in->file, seqnum);
        filemgr_mutex_unlock(handle_in->file);

        fs = _fdb_commit(handle, FDB_COMMIT_MANUAL_WAL_FLUSH,
                !(handle_in->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            if (handle_in->txn) {
                handle->txn = handle_in->txn;
                handle_in->txn = NULL;
            }
            // Close, unlink and free the caller's rollback handle.
            _fdb_kvs_close(handle_in);
            free(handle_in);
            // Link the newly opened handle into the file handle's list
            _fdb_kvs_createNLinkKVHandle(handle->fhandle, handle);
            handle->max_seqnum = 0;
            handle->seqnum = seqnum;
            // Set the newly opened rolled-back handle as caller's handle
            *handle_ptr = handle;
        } else {
            // cancel the rolling-back of the sequence number
            filemgr_mutex_lock(handle_in->file);
            filemgr_set_seqnum(handle_in->file, old_seqnum);
            filemgr_mutex_unlock(handle_in->file);
            free(handle);
            atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
        }
    } else {
        free(handle);
        atomic_cas_uint8_t(&handle_in->handle_busy, 1, 0);
    }

    return fs;
}